

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

bool QResource::registerResource(QString *rccFilename,QString *resourceRoot)

{
  QAtomicInt *pQVar1;
  bool bVar2;
  int iVar3;
  QDynamicBufferResourceRoot *this;
  void *__buf;
  void *pvVar4;
  uchar *puVar5;
  ushort *puVar6;
  ushort *puVar7;
  uchar *b;
  Type *this_00;
  Type *pTVar8;
  size_t __nbytes;
  int __oflag;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_> *this_01;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QMessageLogger local_98;
  QString local_70;
  QString local_58;
  long local_38;
  
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
             *)&local_98;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_70.d.d = (resourceRoot->d).d;
  local_70.d.ptr = (resourceRoot->d).ptr;
  local_70.d.size = (resourceRoot->d).size;
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_70.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  qt_resource_fixResourceRoot(&local_58,&local_70);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
    if ((&(local_58.d.d)->super_QArrayData == (QArrayData *)0x0) ||
       (1 < ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(&local_58,local_58.d.size,KeepSize);
    }
    if (*local_58.d.ptr != L'/') {
      local_98.context.version = 2;
      local_98.context.line = 0;
      local_98.context.file._0_4_ = 0;
      local_98.context.file._4_4_ = 0;
      local_98.context.function._0_4_ = 0;
      local_98.context.function._4_4_ = 0;
      local_98.context.category = "default";
      puVar6 = QString::utf16(rccFilename);
      puVar7 = QString::utf16(resourceRoot);
      QMessageLogger::warning
                (&local_98,
                 "QDir::registerResource: Registering a resource [%ls] must be rooted in an absolute path (start with /) [%ls]"
                 ,puVar6,puVar7);
      bVar2 = false;
      goto LAB_00254166;
    }
  }
  this = (QDynamicBufferResourceRoot *)operator_new(0x70);
  (this->super_QResourceRoot).payloads = (uchar *)0x0;
  (this->super_QResourceRoot).version = 0;
  (this->super_QResourceRoot).ref = (QAtomicInteger<int>)0x0;
  (this->super_QResourceRoot).tree = (uchar *)0x0;
  (this->super_QResourceRoot).names = (uchar *)0x0;
  (this->super_QResourceRoot)._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicBufferResourceRoot_006a8720;
  (this->root).d.d = local_58.d.d;
  (this->root).d.ptr = local_58.d.ptr;
  (this->root).d.size = local_58.d.size;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->buffer = (uchar *)0x0;
  (this->super_QResourceRoot)._vptr_QResourceRoot =
       (_func_int **)&PTR__QDynamicFileResourceRoot_006a86c0;
  this[1].super_QResourceRoot._vptr_QResourceRoot = (_func_int **)0x0;
  this[1].super_QResourceRoot.tree = (uchar *)0x0;
  this[1].super_QResourceRoot.names = (uchar *)0x0;
  this[1].super_QResourceRoot.payloads = (uchar *)0x0;
  this[1].super_QResourceRoot.version = 0;
  this[1].super_QResourceRoot.ref = (QAtomicInteger<int>)0x0;
  local_98.context.version = -0x55555556;
  local_98.context.line = -0x55555556;
  local_98.context.file._0_4_ = 0xaaaaaaaa;
  local_98.context.file._4_4_ = 0xaaaaaaaa;
  QFile::QFile((QFile *)&local_98,rccFilename);
  iVar3 = QFile::open((QFile *)&local_98,(char *)0x1,__oflag);
  if ((char)iVar3 == '\0') {
LAB_0025410a:
    bVar2 = false;
  }
  else {
    __buf = (void *)QFile::size((QFile *)&local_98);
    pvVar4 = __buf;
    if ((long)__buf < 0) {
      pvVar4 = (void *)(**(code **)(CONCAT44(local_98.context.line,local_98.context.version) + 0x80)
                       )();
    }
    iVar3 = QFileDevice::handle((QFileDevice *)&local_98);
    __nbytes = 2;
    puVar5 = (uchar *)mmap64((void *)0x0,(size_t)pvVar4,1,2,iVar3,0);
    if (puVar5 == (uchar *)0xffffffffffffffff) {
      puVar5 = (uchar *)0x0;
    }
    b = puVar5;
    if (puVar5 == (uchar *)0x0) {
      b = (uchar *)operator_new__((ulong)__buf);
      pvVar4 = (void *)QIODevice::read((QIODevice *)&local_98,(int)b,__buf,__nbytes);
      if (__buf != pvVar4) {
        operator_delete__(b);
        goto LAB_0025410a;
      }
    }
    if ((b == (uchar *)0x0) ||
       (bVar2 = anon_unknown.dwarf_454c1b::QDynamicBufferResourceRoot::registerSelf
                          (this,b,(qsizetype)__buf), !bVar2)) goto LAB_0025410a;
    if (puVar5 != (uchar *)0x0) {
      this[1].super_QResourceRoot.payloads = b;
      *(void **)&this[1].super_QResourceRoot.version = __buf;
    }
    QString::operator=((QString *)(this + 1),rccFilename);
    bVar2 = true;
  }
  QFile::~QFile((QFile *)&local_98);
  if (bVar2 == false) {
    (*(this->super_QResourceRoot)._vptr_QResourceRoot[1])(this);
  }
  else {
    LOCK();
    pQVar1 = &(this->super_QResourceRoot).ref;
    (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
              ::operator->(this_01);
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar8 = this_00;
    QRecursiveMutex::tryLock(&this_00->resourceMutex,timeout);
    pTVar8 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_resourceGlobalData>_>
                           *)pTVar8);
    QList<(anonymous_namespace)::QResourceRoot_*>::append
              (&pTVar8->resourceList,(parameter_type)this);
    QRecursiveMutex::unlock(&this_00->resourceMutex);
  }
LAB_00254166:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QResource::registerResource(const QString &rccFilename, const QString &resourceRoot)
{
    QString r = qt_resource_fixResourceRoot(resourceRoot);
    if (!r.isEmpty() && r[0] != u'/') {
        qWarning("QDir::registerResource: Registering a resource [%ls] must be rooted in an "
                 "absolute path (start with /) [%ls]",
                 qUtf16Printable(rccFilename), qUtf16Printable(resourceRoot));
        return false;
    }

    QDynamicFileResourceRoot *root = new QDynamicFileResourceRoot(r);
    if (root->registerSelf(rccFilename)) {
        root->ref.ref();
        const auto locker = qt_scoped_lock(resourceMutex());
        resourceList()->append(root);
        return true;
    }
    delete root;
    return false;
}